

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O0

string * __thiscall
libtorrent::aux::print_listen_interfaces_abi_cxx11_
          (string *__return_storage_ptr__,aux *this,
          vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
          *in)

{
  bool bVar1;
  reference str;
  ulong uVar2;
  pointer pvVar3;
  array<char,_22UL> local_8e;
  address_v6 local_78;
  undefined1 local_60 [8];
  error_code ec;
  listen_interface_t *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  *__range2;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  *in_local;
  string *ret;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2._M_current =
       (listen_interface_t *)
       ::std::
       vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
       ::begin((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
                *)this);
  i = (listen_interface_t *)
      ::std::
      vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
      ::end((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             *)this);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_libtorrent::aux::listen_interface_t_*,_std::vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>_>
                                     *)&i), bVar1) {
    str = __gnu_cxx::
          __normal_iterator<const_libtorrent::aux::listen_interface_t_*,_std::vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>_>
          ::operator*(&__end2);
    uVar2 = ::std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,',');
    }
    boost::system::error_code::error_code((error_code *)local_60);
    boost::asio::ip::make_address_v6(&local_78,&str->device,(error_code *)local_60);
    bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_60);
    if (bVar1) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)str);
    }
    else {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'[');
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)str);
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,']');
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,':');
    to_string(&local_8e,(long)str->port);
    pvVar3 = ::std::array<char,_22UL>::data((array<char,_22UL> *)&local_8e);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pvVar3);
    if ((str->ssl & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'s');
    }
    if ((str->local & 1U) != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'l');
    }
    __gnu_cxx::
    __normal_iterator<const_libtorrent::aux::listen_interface_t_*,_std::vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string print_listen_interfaces(std::vector<listen_interface_t> const& in)
	{
		std::string ret;
		for (auto const& i : in)
		{
			if (!ret.empty()) ret += ',';

			error_code ec;
			make_address_v6(i.device, ec);
			if (!ec)
			{
				// IPv6 addresses must be wrapped in square brackets
				ret += '[';
				ret += i.device;
				ret += ']';
			}
			else
			{
				ret += i.device;
			}
			ret += ':';
			ret += to_string(i.port).data();
			if (i.ssl) ret += 's';
			if (i.local) ret += 'l';
		}

		return ret;
	}